

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xar_read_header(archive_read *a,archive_entry *entry)

{
  long *plVar1;
  undefined8 *puVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  size_t sVar6;
  long *plVar7;
  long *plVar8;
  bool bVar9;
  wchar_t wVar10;
  uint uVar11;
  uchar *p;
  int *piVar12;
  archive_string_conv *paVar13;
  uint *puVar14;
  void *a_sum_val;
  long *plVar15;
  ushort uVar16;
  int iVar17;
  char *pcVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  void *pvVar25;
  long lVar26;
  xattr *pxVar27;
  xar_file *file;
  void *d;
  size_t outbytes;
  size_t used;
  void *local_50;
  long local_48;
  size_t local_40 [2];
  
  plVar1 = (long *)a->format->data;
  if (*plVar1 != 0) goto LAB_00135ff7;
  if (plVar1[0x4a] == 0) {
    paVar13 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    plVar1[0x4a] = (long)paVar13;
    if (paVar13 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
  }
  plVar7 = (long *)a->format->data;
  puVar14 = (uint *)__archive_read_ahead(a,0x1c,(ssize_t *)&local_50);
  pvVar25 = local_50;
  if ((long)local_50 < 0) goto LAB_0013641c;
  if ((long)local_50 < 0x1c) {
    pcVar18 = "Truncated archive header";
LAB_00136407:
    iVar23 = 0x54;
LAB_0013640f:
    archive_set_error(&a->archive,iVar23,pcVar18);
LAB_00136416:
    pvVar25 = (void *)0xffffffe2;
  }
  else {
    uVar22 = *puVar14;
    if ((uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18) !=
        0x78617221) {
      pcVar18 = "Invalid header magic";
      goto LAB_00136407;
    }
    uVar16 = *(ushort *)((long)puVar14 + 6) << 8 | *(ushort *)((long)puVar14 + 6) >> 8;
    if (uVar16 != 1) {
      archive_set_error(&a->archive,0x54,"Unsupported header version(%d)",(ulong)uVar16);
      goto LAB_00136416;
    }
    uVar3 = *(ulong *)(puVar14 + 2);
    plVar7[8] = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                uVar3 << 0x38;
    uVar3 = *(ulong *)(puVar14 + 4);
    uVar22 = puVar14[6];
    __archive_read_consume(a,0x1c);
    *plVar7 = *plVar7 + 0x1c;
    plVar7[9] = 0;
    uVar11 = move_reading_point(a,0x1c);
    if (uVar11 == 0) {
      uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 | uVar22 << 0x18;
      uVar11 = rd_contents_init(a,GZIP,uVar22,0);
      if ((uVar11 != 0) || (uVar11 = xml2_read_toc(a), uVar11 != 0)) goto LAB_00136290;
      plVar7[2] = *plVar7;
      if (plVar7[9] ==
          (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38)) {
        if (uVar22 == 0) {
LAB_001367cd:
          lVar19 = plVar7[0x38];
          if (lVar19 != 0) {
            plVar8 = plVar7 + 0x39;
LAB_001367e7:
            do {
              plVar15 = plVar8;
              plVar8 = (long *)*plVar15;
              if (plVar8 != (long *)0x0) {
                if (*(ulong *)(lVar19 + 0x20) != (ulong)*(uint *)(plVar8 + 1)) goto LAB_001367e7;
                iVar23 = *(int *)((long)plVar8 + 0xc) + 1;
                *(int *)(lVar19 + 0x164) = iVar23;
                lVar26 = plVar8[2];
                local_48 = lVar19;
                if (lVar26 != 0) {
                  do {
                    *(int *)(lVar26 + 0x164) = iVar23;
                    *(undefined8 *)(lVar26 + 0x170) = 0;
                    archive_string_concat
                              ((archive_string *)(lVar26 + 0x168),(archive_string *)(lVar19 + 0x98))
                    ;
                    lVar26 = *(long *)(lVar26 + 8);
                  } while (lVar26 != 0);
                }
                plVar8 = (long *)*plVar15;
                *plVar15 = *plVar8;
                free(plVar8);
                lVar19 = local_48;
              }
              lVar19 = *(long *)(lVar19 + 8);
              plVar8 = plVar7 + 0x39;
            } while (lVar19 != 0);
          }
          (a->archive).archive_format = 0xa0000;
          (a->archive).archive_format_name = "xar";
          pvVar25 = (void *)0x0;
        }
        else {
          uVar11 = move_reading_point(a,plVar7[10]);
          if (uVar11 != 0) goto LAB_00136290;
          a_sum_val = __archive_read_ahead(a,plVar7[0xb],(ssize_t *)&local_50);
          pvVar25 = local_50;
          if (-1 < (long)local_50) {
            if (local_50 < (void *)plVar7[0xb]) {
              pcVar18 = "Truncated archive file";
              goto LAB_00136407;
            }
            iVar23 = checksum_final(a,a_sum_val,(size_t)plVar7[0xb],(void *)0x0,0);
            __archive_read_consume(a,plVar7[0xb]);
            *plVar7 = *plVar7 + plVar7[0xb];
            pvVar25 = (void *)0xffffffe2;
            if (iVar23 == 0) goto LAB_001367cd;
          }
        }
        goto LAB_0013641c;
      }
      pcVar18 = "TOC uncompressed size error";
      iVar23 = -1;
      goto LAB_0013640f;
    }
LAB_00136290:
    pvVar25 = (void *)(ulong)uVar11;
  }
LAB_0013641c:
  if ((int)pvVar25 != 0) {
    return (int)pvVar25;
  }
LAB_00135ff7:
  do {
    iVar23 = *(int *)((long)plVar1 + 0x1bc);
    if (iVar23 < 1) {
      file = (xar_file *)0x0;
    }
    else {
      puVar2 = (undefined8 *)plVar1[0x36];
      file = (xar_file *)*puVar2;
      uVar22 = iVar23 - 1;
      *(uint *)((long)plVar1 + 0x1bc) = uVar22;
      *puVar2 = puVar2[uVar22];
      if (2 < iVar23) {
        uVar3 = *(ulong *)(*(long *)plVar1[0x36] + 0x20);
        iVar23 = 0;
        iVar21 = 1;
        iVar17 = 0;
        do {
          lVar19 = plVar1[0x36];
          uVar24 = *(ulong *)(*(long *)(lVar19 + (long)iVar21 * 8) + 0x20);
          iVar23 = iVar23 + 2;
          iVar20 = iVar21;
          if ((iVar23 < (int)uVar22) &&
             (uVar4 = *(ulong *)(*(long *)(lVar19 + (long)iVar23 * 8) + 0x20), uVar4 < uVar24)) {
            uVar24 = uVar4;
            iVar20 = iVar23;
          }
          if (uVar3 <= uVar24) break;
          uVar5 = *(undefined8 *)(lVar19 + (long)iVar17 * 8);
          *(undefined8 *)(lVar19 + (long)iVar17 * 8) = *(undefined8 *)(lVar19 + (long)iVar20 * 8);
          *(undefined8 *)(plVar1[0x36] + (long)iVar20 * 8) = uVar5;
          iVar21 = iVar20 * 2 + 1;
          iVar23 = iVar20 * 2;
          iVar17 = iVar20;
        } while (iVar21 < (int)uVar22);
      }
    }
    plVar1[0x34] = (long)file;
    if (file == (xar_file *)0x0) {
      *(undefined4 *)(plVar1 + 3) = 1;
      return 1;
    }
    if (((file->mode & 0xf000) != 0x4000) || (file->has != 0x82)) break;
    file_free(file);
  } while( true );
  if ((file->has & 0x20000) != 0) {
    archive_entry_set_atime(entry,file->atime,0);
  }
  if ((file->has & 0x8000) != 0) {
    archive_entry_set_ctime(entry,file->ctime,0);
  }
  if ((file->has & 0x10000) != 0) {
    archive_entry_set_mtime(entry,file->mtime,0);
  }
  archive_entry_set_gid(entry,file->gid);
  sVar6 = (file->gname).length;
  iVar23 = 0;
  if ((sVar6 != 0) &&
     (wVar10 = _archive_entry_copy_gname_l
                         (entry,(file->gname).s,sVar6,(archive_string_conv *)plVar1[0x4a]),
     wVar10 != L'\0')) {
    piVar12 = __errno_location();
    if (*piVar12 == 0xc) {
      pcVar18 = "Can\'t allocate memory for Gname";
      goto LAB_001363e6;
    }
    pcVar18 = archive_string_conversion_charset_name((archive_string_conv *)plVar1[0x4a]);
    archive_set_error(&a->archive,0x54,"Gname cannot be converted from %s to current locale.",
                      pcVar18);
    iVar23 = -0x14;
  }
  archive_entry_set_uid(entry,file->uid);
  sVar6 = (file->uname).length;
  if ((sVar6 != 0) &&
     (wVar10 = _archive_entry_copy_uname_l
                         (entry,(file->uname).s,sVar6,(archive_string_conv *)plVar1[0x4a]),
     wVar10 != L'\0')) {
    piVar12 = __errno_location();
    if (*piVar12 == 0xc) {
      pcVar18 = "Can\'t allocate memory for Uname";
      goto LAB_001363e6;
    }
    pcVar18 = archive_string_conversion_charset_name((archive_string_conv *)plVar1[0x4a]);
    archive_set_error(&a->archive,0x54,"Uname cannot be converted from %s to current locale.",
                      pcVar18);
    iVar23 = -0x14;
  }
  archive_entry_set_mode(entry,file->mode);
  wVar10 = _archive_entry_copy_pathname_l
                     (entry,(file->pathname).s,(file->pathname).length,
                      (archive_string_conv *)plVar1[0x4a]);
  if (wVar10 != L'\0') {
    piVar12 = __errno_location();
    if (*piVar12 == 0xc) {
      pcVar18 = "Can\'t allocate memory for Pathname";
      goto LAB_001363e6;
    }
    pcVar18 = archive_string_conversion_charset_name((archive_string_conv *)plVar1[0x4a]);
    archive_set_error(&a->archive,0x54,"Pathname cannot be converted from %s to current locale.",
                      pcVar18);
    iVar23 = -0x14;
  }
  sVar6 = (file->symlink).length;
  if ((sVar6 != 0) &&
     (wVar10 = _archive_entry_copy_symlink_l
                         (entry,(file->symlink).s,sVar6,(archive_string_conv *)plVar1[0x4a]),
     wVar10 != L'\0')) {
    piVar12 = __errno_location();
    if (*piVar12 == 0xc) {
      pcVar18 = "Can\'t allocate memory for Linkname";
LAB_001363e6:
      archive_set_error(&a->archive,0xc,pcVar18);
      return -0x1e;
    }
    pcVar18 = archive_string_conversion_charset_name((archive_string_conv *)plVar1[0x4a]);
    archive_set_error(&a->archive,0x54,"Linkname cannot be converted from %s to current locale.",
                      pcVar18);
    iVar23 = -0x14;
  }
  if ((file->mode & 0xf000) == 0x4000) {
    uVar22 = file->subdirs + 2;
  }
  else {
    uVar22 = file->nlink;
  }
  archive_entry_set_nlink(entry,uVar22);
  archive_entry_set_size(entry,file->size);
  if ((file->hardlink).length != 0) {
    archive_entry_set_hardlink(entry,(file->hardlink).s);
  }
  archive_entry_set_ino64(entry,file->ino64);
  if ((file->has & 0x100) != 0) {
    archive_entry_set_dev(entry,file->dev);
  }
  if ((file->has & 0x200) != 0) {
    archive_entry_set_devmajor(entry,file->devmajor);
  }
  if ((file->has & 0x400) != 0) {
    archive_entry_set_devminor(entry,file->devminor);
  }
  if ((file->fflags_text).length != 0) {
    archive_entry_copy_fflags_text(entry,(file->fflags_text).s);
  }
  *(undefined4 *)(plVar1 + 0x3a) = 1;
  plVar1[0x3b] = 0;
  plVar1[0x3c] = file->length;
  plVar1[0x3e] = file->size;
  *(enctype *)(plVar1 + 0x3f) = file->encoding;
  plVar1[0x44] = *(long *)((file->a_sum).val + 0x10);
  lVar19 = *(long *)&file->a_sum;
  sVar6 = (file->a_sum).len;
  lVar26 = *(long *)((file->a_sum).val + 8);
  plVar1[0x42] = *(long *)(file->a_sum).val;
  plVar1[0x43] = lVar26;
  plVar1[0x40] = lVar19;
  plVar1[0x41] = sVar6;
  plVar1[0x49] = *(long *)((file->e_sum).val + 0x10);
  lVar19 = *(long *)&file->e_sum;
  sVar6 = (file->e_sum).len;
  lVar26 = *(long *)((file->e_sum).val + 8);
  plVar1[0x47] = *(long *)(file->e_sum).val;
  plVar1[0x48] = lVar26;
  plVar1[0x45] = lVar19;
  plVar1[0x46] = sVar6;
  pxVar27 = file->xattr_list;
  do {
    if (pxVar27 == (xattr *)0x0) break;
    local_40[0] = 0;
    local_40[1] = 0;
    iVar23 = move_reading_point(a,pxVar27->offset);
    bVar9 = true;
    if ((iVar23 == 0) &&
       (iVar23 = rd_contents_init(a,pxVar27->encoding,(pxVar27->a_sum).alg,(pxVar27->e_sum).alg),
       iVar23 == 0)) {
      local_50 = (void *)0x0;
      iVar23 = rd_contents(a,&local_50,local_40,local_40 + 1,pxVar27->length);
      sVar6 = local_40[0];
      if (iVar23 == 0) {
        if (local_40[0] == pxVar27->size) {
          iVar23 = checksum_final(a,(pxVar27->a_sum).val,(pxVar27->a_sum).len,(pxVar27->e_sum).val,
                                  (pxVar27->e_sum).len);
          if (iVar23 == 0) {
            pcVar18 = (pxVar27->name).s;
            if (pcVar18 != (char *)0x0) {
              archive_entry_xattr_add_entry(entry,pcVar18,local_50,sVar6);
              pxVar27 = pxVar27->next;
              iVar23 = 0;
              bVar9 = false;
              goto LAB_0013660b;
            }
            pcVar18 = "Xattr name error";
          }
          else {
            pcVar18 = "Xattr checksum error";
          }
          archive_set_error(&a->archive,-1,pcVar18);
          iVar23 = -0x14;
        }
        else {
          archive_set_error(&a->archive,-1,"Decompressed size error");
          iVar23 = -0x1e;
        }
      }
    }
LAB_0013660b:
  } while (!bVar9);
  if (iVar23 == 0) {
    if (plVar1[0x3c] == 0) {
      iVar23 = 0;
    }
    else {
      iVar23 = move_reading_point(a,file->offset);
    }
  }
  file_free(file);
  return iVar23;
}

Assistant:

static int
xar_read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct xar_file *file;
	struct xattr *xattr;
	int r;

	xar = (struct xar *)(a->format->data);
	r = ARCHIVE_OK;

	if (xar->offset == 0) {
		/* Create a character conversion object. */
		if (xar->sconv == NULL) {
			xar->sconv = archive_string_conversion_from_charset(
			    &(a->archive), "UTF-8", 1);
			if (xar->sconv == NULL)
				return (ARCHIVE_FATAL);
		}

		/* Read TOC. */
		r = read_toc(a);
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		file = xar->file = heap_get_entry(&(xar->file_queue));
		if (file == NULL) {
			xar->end_of_file = 1;
			return (ARCHIVE_EOF);
		}
		if ((file->mode & AE_IFMT) != AE_IFDIR)
			break;
		if (file->has != (HAS_PATHNAME | HAS_TYPE))
			break;
		/*
		 * If a file type is a directory and it does not have
		 * any metadata, do not export.
		 */
		file_free(file);
	}
        if (file->has & HAS_ATIME) {
          archive_entry_set_atime(entry, file->atime, 0);
        }
        if (file->has & HAS_CTIME) {
          archive_entry_set_ctime(entry, file->ctime, 0);
        }
        if (file->has & HAS_MTIME) {
          archive_entry_set_mtime(entry, file->mtime, 0);
        }
	archive_entry_set_gid(entry, file->gid);
	if (file->gname.length > 0 &&
	    archive_entry_copy_gname_l(entry, file->gname.s,
		archive_strlen(&(file->gname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Gname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_uid(entry, file->uid);
	if (file->uname.length > 0 &&
	    archive_entry_copy_uname_l(entry, file->uname.s,
		archive_strlen(&(file->uname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Uname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_mode(entry, file->mode);
	if (archive_entry_copy_pathname_l(entry, file->pathname.s,
	    archive_strlen(&(file->pathname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}


	if (file->symlink.length > 0 &&
	    archive_entry_copy_symlink_l(entry, file->symlink.s,
		archive_strlen(&(file->symlink)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Linkname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	/* Set proper nlink. */
	if ((file->mode & AE_IFMT) == AE_IFDIR)
		archive_entry_set_nlink(entry, file->subdirs + 2);
	else
		archive_entry_set_nlink(entry, file->nlink);
	archive_entry_set_size(entry, file->size);
	if (archive_strlen(&(file->hardlink)) > 0)
		archive_entry_set_hardlink(entry, file->hardlink.s);
	archive_entry_set_ino64(entry, file->ino64);
	if (file->has & HAS_DEV)
		archive_entry_set_dev(entry, file->dev);
	if (file->has & HAS_DEVMAJOR)
		archive_entry_set_devmajor(entry, file->devmajor);
	if (file->has & HAS_DEVMINOR)
		archive_entry_set_devminor(entry, file->devminor);
	if (archive_strlen(&(file->fflags_text)) > 0)
		archive_entry_copy_fflags_text(entry, file->fflags_text.s);

	xar->entry_init = 1;
	xar->entry_total = 0;
	xar->entry_remaining = file->length;
	xar->entry_size = file->size;
	xar->entry_encoding = file->encoding;
	xar->entry_a_sum = file->a_sum;
	xar->entry_e_sum = file->e_sum;
	/*
	 * Read extended attributes.
	 */
	xattr = file->xattr_list;
	while (xattr != NULL) {
		const void *d;
		size_t outbytes = 0;
		size_t used = 0;

		r = move_reading_point(a, xattr->offset);
		if (r != ARCHIVE_OK)
			break;
		r = rd_contents_init(a, xattr->encoding,
		    xattr->a_sum.alg, xattr->e_sum.alg);
		if (r != ARCHIVE_OK)
			break;
		d = NULL;
		r = rd_contents(a, &d, &outbytes, &used, xattr->length);
		if (r != ARCHIVE_OK)
			break;
		if (outbytes != xattr->size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			break;
		}
		r = checksum_final(a,
		    xattr->a_sum.val, xattr->a_sum.len,
		    xattr->e_sum.val, xattr->e_sum.len);
		if (r != ARCHIVE_OK) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr checksum error");
			r = ARCHIVE_WARN;
			break;
#endif
		}
		if (xattr->name.s == NULL) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr name error");
			r = ARCHIVE_WARN;
			break;
		}
		archive_entry_xattr_add_entry(entry,
		    xattr->name.s, d, outbytes);
		xattr = xattr->next;
	}
	if (r != ARCHIVE_OK) {
		file_free(file);
		return (r);
	}

	if (xar->entry_remaining > 0)
		/* Move reading point to the beginning of current
		 * file contents. */
		r = move_reading_point(a, file->offset);
	else
		r = ARCHIVE_OK;

	file_free(file);
	return (r);
}